

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_rawparams::test_method(rpc_rawparams *this)

{
  long lVar1;
  string args;
  string args_00;
  string args_01;
  string args_02;
  string args_03;
  string args_04;
  string args_05;
  string args_06;
  string args_07;
  string args_08;
  string args_09;
  string args_10;
  string args_11;
  string args_12;
  string args_13;
  string args_14;
  string args_15;
  string args_16;
  string args_17;
  string args_18;
  UniValue *pUVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  string_view key;
  const_string file_24;
  string_view key_00;
  const_string file_25;
  string_view key_01;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  undefined4 in_stack_ffffffffffffebf8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffebfc;
  undefined4 uVar7;
  check_type cVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  undefined8 in_stack_ffffffffffffec08;
  char *pcVar8;
  undefined8 in_stack_ffffffffffffec10;
  char *local_13a8;
  char *local_13a0;
  undefined1 *local_1398;
  undefined1 *local_1390;
  char *local_1388;
  char *local_1380;
  undefined1 *local_1378;
  undefined1 *local_1370;
  char *local_1368;
  char *local_1360;
  char *local_1328;
  char *local_1320;
  undefined1 *local_1318;
  undefined1 *local_1310;
  char *local_1308;
  char *local_1300;
  undefined1 *local_12f8;
  undefined1 *local_12f0;
  char *local_12e8;
  char *local_12e0;
  char *local_12a8;
  char *local_12a0;
  undefined1 *local_1298;
  undefined1 *local_1290;
  char *local_1288;
  char *local_1280;
  undefined1 *local_1278;
  undefined1 *local_1270;
  char *local_1268;
  char *local_1260;
  char *local_1228;
  char *local_1220;
  undefined1 *local_1218;
  undefined1 *local_1210;
  char *local_1208;
  char *local_1200;
  undefined1 *local_11f8;
  undefined1 *local_11f0;
  char *local_11e8;
  char *local_11e0;
  char *local_11a8;
  char *local_11a0;
  undefined1 *local_1198;
  undefined1 *local_1190;
  char *local_1188;
  char *local_1180;
  undefined1 *local_1178;
  undefined1 *local_1170;
  char *local_1168;
  char *local_1160;
  char *local_1128;
  char *local_1120;
  undefined1 *local_1118;
  undefined1 *local_1110;
  char *local_1108;
  char *local_1100;
  allocator<char> local_10f1 [49];
  char *local_10c0;
  char *local_10b8;
  undefined1 *local_10b0;
  undefined1 *local_10a8;
  char *local_10a0;
  char *local_1098;
  undefined1 *local_1090;
  undefined1 *local_1088;
  char *local_1080;
  char *local_1078;
  char *local_1070;
  char *local_1068;
  undefined1 *local_1060;
  undefined1 *local_1058;
  char *local_1050;
  char *local_1048;
  char *local_1040;
  char *local_1038;
  undefined1 *local_1030;
  undefined1 *local_1028;
  char *local_1020;
  char *local_1018;
  char *local_1010;
  char *local_1008;
  undefined1 *local_1000;
  undefined1 *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fb0;
  char *local_fa8;
  undefined1 *local_fa0;
  undefined1 *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f50;
  char *local_f48;
  undefined1 *local_f40;
  undefined1 *local_f38;
  char *local_f30;
  char *local_f28;
  undefined1 *local_f20;
  undefined1 *local_f18;
  char *local_f10;
  char *local_f08;
  char *local_ed0;
  char *local_ec8;
  undefined1 *local_ec0;
  undefined1 *local_eb8;
  char *local_eb0;
  char *local_ea8;
  undefined1 *local_ea0;
  undefined1 *local_e98;
  char *local_e90;
  char *local_e88;
  char *local_e50;
  char *local_e48;
  undefined1 *local_e40;
  undefined1 *local_e38;
  char *local_e30;
  char *local_e28;
  undefined1 *local_e20;
  undefined1 *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_dd0;
  char *local_dc8;
  undefined1 *local_dc0;
  undefined1 *local_db8;
  char *local_db0;
  char *local_da8;
  undefined1 *local_da0;
  undefined1 *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d50;
  char *local_d48;
  undefined1 *local_d40;
  undefined1 *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_cf0;
  char *local_ce8;
  undefined1 *local_ce0;
  undefined1 *local_cd8;
  char *local_cd0;
  char *local_cc8;
  undefined1 *local_cc0;
  undefined1 *local_cb8;
  char *local_cb0;
  char *local_ca8;
  char *local_c70;
  char *local_c68;
  undefined1 *local_c60;
  undefined1 *local_c58;
  char *local_c50;
  char *local_c48;
  undefined1 *local_c40;
  undefined1 *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_bf0;
  char *local_be8;
  undefined1 *local_be0;
  undefined1 *local_bd8;
  char *local_bd0;
  char *local_bc8;
  undefined1 *local_bc0;
  undefined1 *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_b70;
  char *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  char *local_b50;
  char *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_af0;
  char *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  char *local_ad0;
  char *local_ac8;
  undefined1 *local_ac0;
  undefined1 *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  UniValue local_980;
  string local_928 [32];
  UniValue local_908;
  string local_8b0 [32];
  UniValue local_890;
  string local_838 [32];
  UniValue local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  UniValue local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  undefined1 local_6a8 [16];
  undefined1 *local_698;
  char *local_690 [8];
  string rawtx;
  string local_630 [32];
  UniValue local_610;
  string local_5b8 [32];
  UniValue local_598;
  string local_540 [32];
  UniValue local_520;
  string local_4c8 [32];
  UniValue local_4a8;
  string local_450 [32];
  UniValue local_430;
  string local_3d8 [32];
  UniValue local_3b8;
  string local_360 [32];
  UniValue local_340;
  string local_2e8 [32];
  UniValue local_2c8;
  string local_270 [32];
  UniValue local_250;
  string local_1f8 [32];
  UniValue local_1d8;
  string local_180 [32];
  UniValue local_160;
  string local_108 [32];
  UniValue local_e8;
  UniValue r;
  
  local_1030 = (undefined1 *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  r.val._M_dataplus._M_p = (pointer)&r.val.field_2;
  r.val._M_string_length = 0;
  r.val.field_2._M_local_buf[0] = '\0';
  r.typ = VNULL;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_9b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9a8 = "";
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8d;
  file.m_begin = (iterator)&local_9b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_9c0,msg);
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"getrawtransaction",(allocator<char> *)local_6a8);
  args._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebfc;
  args._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebf8;
  args._M_string_length = (size_type)_cVar9;
  args.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_e8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args);
  UniValue::~UniValue(&local_e8);
  std::__cxx11::string::~string(local_108);
  local_9d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8d;
  file_00.m_begin = (iterator)&local_9d0;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_9e0,
             msg_00);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_9f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9e8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_9f0
             ,0x8d);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_a30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a28 = "";
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x8e;
  file_01.m_begin = (iterator)&local_a30;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_a40,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,"getrawtransaction not_hex",(allocator<char> *)local_6a8);
  args_00._M_dataplus._M_p._4_4_ = uVar7;
  args_00._M_dataplus._M_p._0_4_ = uVar6;
  args_00._M_string_length = (size_type)_cVar9;
  args_00.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_00.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_160,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_00);
  UniValue::~UniValue(&local_160);
  std::__cxx11::string::~string(local_180);
  local_a50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a48 = "";
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x8e;
  file_02.m_begin = (iterator)&local_a50;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_a60,
             msg_02);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a68 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_a70
             ,0x8e);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_ab0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_aa8 = "";
  local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x8f;
  file_03.m_begin = (iterator)&local_ab0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_ac0,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,
             "getrawtransaction a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed not_int"
             ,(allocator<char> *)local_6a8);
  args_01._M_dataplus._M_p._4_4_ = uVar7;
  args_01._M_dataplus._M_p._0_4_ = uVar6;
  args_01._M_string_length = (size_type)_cVar9;
  args_01.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_01.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_1d8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_01);
  UniValue::~UniValue(&local_1d8);
  std::__cxx11::string::~string(local_1f8);
  local_ad0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ac8 = "";
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x8f;
  file_04.m_begin = (iterator)&local_ad0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_ae0,
             msg_04);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_af0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ae8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_af0
             ,0x8f);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_b30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b28 = "";
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x91;
  file_05.m_begin = (iterator)&local_b30;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_b40,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"createrawtransaction",(allocator<char> *)local_6a8);
  args_02._M_dataplus._M_p._4_4_ = uVar7;
  args_02._M_dataplus._M_p._0_4_ = uVar6;
  args_02._M_string_length = (size_type)_cVar9;
  args_02.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_02.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_250,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_02);
  UniValue::~UniValue(&local_250);
  std::__cxx11::string::~string(local_270);
  local_b50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b48 = "";
  local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x91;
  file_06.m_begin = (iterator)&local_b50;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_b60,
             msg_06);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_b70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b68 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_b70
             ,0x91);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_bb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ba8 = "";
  local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x92;
  file_07.m_begin = (iterator)&local_bb0;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_bc0,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"createrawtransaction null null",(allocator<char> *)local_6a8);
  args_03._M_dataplus._M_p._4_4_ = uVar7;
  args_03._M_dataplus._M_p._0_4_ = uVar6;
  args_03._M_string_length = (size_type)_cVar9;
  args_03.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_03.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_2c8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_03);
  UniValue::~UniValue(&local_2c8);
  std::__cxx11::string::~string(local_2e8);
  local_bd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_bc8 = "";
  local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x92;
  file_08.m_begin = (iterator)&local_bd0;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_be0,
             msg_08);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_bf0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_be8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_bf0
             ,0x92);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_c30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c28 = "";
  local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x93;
  file_09.m_begin = (iterator)&local_c30;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_c40,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,"createrawtransaction not_array",(allocator<char> *)local_6a8);
  args_04._M_dataplus._M_p._4_4_ = uVar7;
  args_04._M_dataplus._M_p._0_4_ = uVar6;
  args_04._M_string_length = (size_type)_cVar9;
  args_04.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_04.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_340,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_04);
  UniValue::~UniValue(&local_340);
  std::__cxx11::string::~string(local_360);
  local_c50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c48 = "";
  local_c60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x93;
  file_10.m_begin = (iterator)&local_c50;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_c60,
             msg_10);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_c70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c68 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_c70
             ,0x93);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_cb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ca8 = "";
  local_cc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x94;
  file_11.m_begin = (iterator)&local_cb0;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_cc0,
             msg_11);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d8,"createrawtransaction {} {}",(allocator<char> *)local_6a8);
  args_05._M_dataplus._M_p._4_4_ = uVar7;
  args_05._M_dataplus._M_p._0_4_ = uVar6;
  args_05._M_string_length = (size_type)_cVar9;
  args_05.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_05.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_3b8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_05);
  UniValue::~UniValue(&local_3b8);
  std::__cxx11::string::~string(local_3d8);
  local_cd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_cc8 = "";
  local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x94;
  file_12.m_begin = (iterator)&local_cd0;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_ce0,
             msg_12);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_cf0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ce8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_cf0
             ,0x94);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            (local_450,"createrawtransaction [] {}",(allocator<char> *)local_6a8);
  args_06._M_dataplus._M_p._4_4_ = uVar7;
  args_06._M_dataplus._M_p._0_4_ = uVar6;
  args_06._M_string_length = (size_type)_cVar9;
  args_06.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_06.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_430,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_06);
  UniValue::~UniValue(&local_430);
  std::__cxx11::string::~string(local_450);
  local_d30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d28 = "";
  local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x95;
  file_13.m_begin = (iterator)&local_d30;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_d40,
             msg_13);
  rawtx._M_dataplus._M_p._0_1_ = 1;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_0114b350;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "no exceptions thrown by CallRPC(\"createrawtransaction [] {}\")";
  local_d50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d48 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_d50
             ,0x95);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_d90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d88 = "";
  local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x96;
  file_14.m_begin = (iterator)&local_d90;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_da0,
             msg_14);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c8,"createrawtransaction [] {} extra",(allocator<char> *)local_6a8);
  args_07._M_dataplus._M_p._4_4_ = uVar7;
  args_07._M_dataplus._M_p._0_4_ = uVar6;
  args_07._M_string_length = (size_type)_cVar9;
  args_07.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_07.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_4a8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_07);
  UniValue::~UniValue(&local_4a8);
  std::__cxx11::string::~string(local_4c8);
  local_db0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_da8 = "";
  local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x96;
  file_15.m_begin = (iterator)&local_db0;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_dc0,
             msg_15);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_dd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_dc8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_dd0
             ,0x96);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_e10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e08 = "";
  local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x98;
  file_16.m_begin = (iterator)&local_e10;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_e20,
             msg_16);
  std::__cxx11::string::string<std::allocator<char>>
            (local_540,"decoderawtransaction",(allocator<char> *)local_6a8);
  args_08._M_dataplus._M_p._4_4_ = uVar7;
  args_08._M_dataplus._M_p._0_4_ = uVar6;
  args_08._M_string_length = (size_type)_cVar9;
  args_08.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_08.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_520,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_08);
  UniValue::~UniValue(&local_520);
  std::__cxx11::string::~string(local_540);
  local_e30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e28 = "";
  local_e40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x98;
  file_17.m_begin = (iterator)&local_e30;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_e40,
             msg_17);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_e50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e48 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_e50
             ,0x98);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_e90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e88 = "";
  local_ea0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x99;
  file_18.m_begin = (iterator)&local_e90;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_ea0,
             msg_18);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b8,"decoderawtransaction null",(allocator<char> *)local_6a8);
  args_09._M_dataplus._M_p._4_4_ = uVar7;
  args_09._M_dataplus._M_p._0_4_ = uVar6;
  args_09._M_string_length = (size_type)_cVar9;
  args_09.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_09.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_598,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_09);
  UniValue::~UniValue(&local_598);
  std::__cxx11::string::~string(local_5b8);
  local_eb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ea8 = "";
  local_ec0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_eb8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x99;
  file_19.m_begin = (iterator)&local_eb0;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_ec0,
             msg_19);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_ed0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ec8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_ed0
             ,0x99);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  local_f10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f08 = "";
  local_f20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x9a;
  file_20.m_begin = (iterator)&local_f10;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_f20,
             msg_20);
  std::__cxx11::string::string<std::allocator<char>>
            (local_630,"decoderawtransaction DEADBEEF",(allocator<char> *)local_6a8);
  args_10._M_dataplus._M_p._4_4_ = uVar7;
  args_10._M_dataplus._M_p._0_4_ = uVar6;
  args_10._M_string_length = (size_type)_cVar9;
  args_10.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_10.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_610,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_10);
  UniValue::~UniValue(&local_610);
  std::__cxx11::string::~string(local_630);
  local_f30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f28 = "";
  local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x9a;
  file_21.m_begin = (iterator)&local_f30;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_f40,
             msg_21);
  rawtx._M_dataplus._M_p._0_1_ = 0;
  rawtx._M_string_length = 0;
  rawtx.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_f50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f48 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rawtx,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,(size_t)&local_f50
             ,0x9a);
  boost::detail::shared_count::~shared_count((shared_count *)&rawtx.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rawtx,
             "0100000001a15d57094aa7a21a28cb20b59aab8fc7d1149a3bdbcddba9c622e4f5f6a99ece010000006c493046022100f93bb0e7d8db7bd46e40132d1f8242026e045f03a0efe71bbb8e3f475e970d790221009337cd7f1f929f00cc6ff01f03729b069a7c21b59b1736ddfee5db5946c5da8c0121033b9b137ee87d5a812d6f506efdd37f0affa7ffc310711c06c7f3e097c9447c52ffffffff0100e1f505000000001976a9140389035a9225b3839e2bbf32d826a1e222031fd888ac00000000"
             ,(allocator<char> *)local_6a8);
  __a = &local_7a0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"decoderawtransaction ",(allocator<char> *)__a);
  std::operator+(&local_6c8,&local_6e8,&rawtx);
  args_11._M_dataplus._M_p._4_4_ = uVar7;
  args_11._M_dataplus._M_p._0_4_ = uVar6;
  args_11._M_string_length = (size_type)_cVar9;
  args_11.field_2._M_allocated_capacity = in_stack_ffffffffffffec08;
  args_11.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC((UniValue *)local_6a8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_11);
  UniValue::operator=(&r,(UniValue *)local_6a8);
  UniValue::~UniValue((UniValue *)local_6a8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6e8);
  local_f90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f88 = "";
  local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x9c;
  file_22.m_begin = (iterator)&local_f90;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_fa0,
             msg_22);
  local_6e8._M_dataplus._M_p._0_4_ = CONCAT31(local_6e8._M_dataplus._M_p._1_3_,1);
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_0114b3d0;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "no exceptions thrown by r = CallRPC(std::string(\"decoderawtransaction \")+rawtx)"
  ;
  local_fb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fa8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_6e8,(lazy_ostream *)local_6a8,1,1,WARN,_cVar9,
             (size_t)&local_fb0,0x9c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_6e8.field_2._M_allocated_capacity);
  local_ff0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fe8 = "";
  local_1000 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ff8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x9d;
  file_23.m_begin = (iterator)&local_ff0;
  msg_23.m_end = pvVar4;
  msg_23.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_1000,
             msg_23);
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_1010 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1008 = "";
  pUVar2 = UniValue::get_obj(&r);
  key._M_str = "size";
  key._M_len = 4;
  pUVar2 = UniValue::find_value(pUVar2,key);
  local_6e8._M_dataplus._M_p._0_4_ = UniValue::getInt<int>(pUVar2);
  pbVar5 = &local_6e8;
  local_7a0._M_dataplus._M_p._0_4_ = 0xc1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_6a8,&local_1010,0x9d,1,2,pbVar5,0xbd1e57,__a,"193");
  local_1020 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1018 = "";
  local_1030 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1028 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x9e;
  file_24.m_begin = (iterator)&local_1020;
  msg_24.m_end = (iterator)pbVar5;
  msg_24.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_1030,
             msg_24);
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_1040 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1038 = "";
  pUVar2 = UniValue::get_obj(&r);
  key_00._M_str = "version";
  key_00._M_len = 7;
  pUVar2 = UniValue::find_value(pUVar2,key_00);
  local_6e8._M_dataplus._M_p._0_4_ = UniValue::getInt<int>(pUVar2);
  pbVar5 = &local_6e8;
  local_7a0._M_dataplus._M_p._0_4_ = 1;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_6a8,&local_1040,0x9e,1,2,pbVar5,0xbd1e88,__a,"1");
  local_1050 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1048 = "";
  local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1058 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x9f;
  file_25.m_begin = (iterator)&local_1050;
  msg_25.m_end = (iterator)pbVar5;
  msg_25.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_1060,
             msg_25);
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_1070 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1068 = "";
  pUVar2 = UniValue::get_obj(&r);
  key_01._M_str = "locktime";
  key_01._M_len = 8;
  pUVar2 = UniValue::find_value(pUVar2,key_01);
  local_6e8._M_dataplus._M_p._0_4_ = UniValue::getInt<int>(pUVar2);
  pbVar5 = &local_6e8;
  local_7a0._M_dataplus._M_p._0_4_ = 0;
  pcVar8 = "0";
  uVar6 = 0xbd1eb8;
  uVar7 = 0;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_6a8,&local_1070,0x9f,1);
  local_1080 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1078 = "";
  local_1090 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1088 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0xa0;
  file_26.m_begin = (iterator)&local_1080;
  msg_26.m_end = (iterator)pbVar5;
  msg_26.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_1090,
             msg_26);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"decoderawtransaction ",(allocator<char> *)&local_7a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8,
                 &local_6e8,&rawtx);
  std::operator+(&local_760,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8,
                 " extra");
  args_12._M_dataplus._M_p._4_4_ = uVar7;
  args_12._M_dataplus._M_p._0_4_ = uVar6;
  args_12._M_string_length = (size_type)__a;
  args_12.field_2._M_allocated_capacity = (size_type)pcVar8;
  args_12.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_740,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_12);
  UniValue::~UniValue(&local_740);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)local_6a8);
  std::__cxx11::string::~string((string *)&local_6e8);
  local_10a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1098 = "";
  local_10b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0xa0;
  file_27.m_begin = (iterator)&local_10a0;
  msg_27.m_end = (iterator)pbVar5;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_10b0,
             msg_27);
  local_6e8._M_dataplus._M_p._0_4_ = (uint)local_6e8._M_dataplus._M_p & 0xffffff00;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_10c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10b8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_6e8,(lazy_ostream *)local_6a8,1,1,WARN,(check_type)__a,
             (size_t)&local_10c0,0xa0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_6e8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a0,"decoderawtransaction ",local_10f1);
  std::operator+(&local_6e8,&local_7a0,&rawtx);
  std::operator+(&local_780,&local_6e8," false");
  args_13._M_dataplus._M_p._4_4_ = uVar7;
  args_13._M_dataplus._M_p._0_4_ = uVar6;
  args_13._M_string_length = (size_type)__a;
  args_13.field_2._M_allocated_capacity = (size_type)pcVar8;
  args_13.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC((UniValue *)local_6a8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_13);
  UniValue::operator=(&r,(UniValue *)local_6a8);
  UniValue::~UniValue((UniValue *)local_6a8);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_7a0);
  local_1108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1100 = "";
  local_1118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0xa1;
  file_28.m_begin = (iterator)&local_1108;
  msg_28.m_end = pvVar4;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_1118,
             msg_28);
  local_6e8._M_dataplus._M_p._0_1_ = 1;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_0114b450;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = 
  "no exceptions thrown by r = CallRPC(std::string(\"decoderawtransaction \")+rawtx+\" false\")";
  local_1128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1120 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_6e8,(lazy_ostream *)local_6a8,1,1,WARN,(check_type)__a,
             (size_t)&local_1128,0xa1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_6e8.field_2._M_allocated_capacity);
  local_1168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1160 = "";
  local_1178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0xa2;
  file_29.m_begin = (iterator)&local_1168;
  msg_29.m_end = pvVar4;
  msg_29.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_1178,
             msg_29);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a0,"decoderawtransaction ",local_10f1);
  std::operator+(&local_6e8,&local_7a0,&rawtx);
  std::operator+(&local_7c0,&local_6e8," false extra");
  args_14._M_dataplus._M_p._4_4_ = uVar7;
  args_14._M_dataplus._M_p._0_4_ = uVar6;
  args_14._M_string_length = (size_type)__a;
  args_14.field_2._M_allocated_capacity = (size_type)pcVar8;
  args_14.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC((UniValue *)local_6a8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_14);
  UniValue::operator=(&r,(UniValue *)local_6a8);
  UniValue::~UniValue((UniValue *)local_6a8);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_7a0);
  local_1188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1180 = "";
  local_1198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0xa2;
  file_30.m_begin = (iterator)&local_1188;
  msg_30.m_end = pvVar4;
  msg_30.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_1198,
             msg_30);
  local_6e8._M_dataplus._M_p._0_1_ = 0;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_11a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11a0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_6e8,(lazy_ostream *)local_6a8,1,1,WARN,(check_type)__a,
             (size_t)&local_11a8,0xa2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_6e8.field_2._M_allocated_capacity);
  local_11e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11e0 = "";
  local_11f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0xa5;
  file_31.m_begin = (iterator)&local_11e8;
  msg_31.m_end = pvVar4;
  msg_31.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_11f8,
             msg_31);
  std::__cxx11::string::string<std::allocator<char>>
            (local_838,"sendrawtransaction",(allocator<char> *)local_6a8);
  args_15._M_dataplus._M_p._4_4_ = uVar7;
  args_15._M_dataplus._M_p._0_4_ = uVar6;
  args_15._M_string_length = (size_type)__a;
  args_15.field_2._M_allocated_capacity = (size_type)pcVar8;
  args_15.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_818,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_15);
  UniValue::~UniValue(&local_818);
  std::__cxx11::string::~string(local_838);
  local_1208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1200 = "";
  local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0xa5;
  file_32.m_begin = (iterator)&local_1208;
  msg_32.m_end = pvVar4;
  msg_32.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_1218,
             msg_32);
  local_6e8._M_dataplus._M_p._0_1_ = 0;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_1228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1220 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_6e8,(lazy_ostream *)local_6a8,1,1,WARN,(check_type)__a,
             (size_t)&local_1228,0xa5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_6e8.field_2._M_allocated_capacity);
  local_1268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1260 = "";
  local_1278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0xa6;
  file_33.m_begin = (iterator)&local_1268;
  msg_33.m_end = pvVar4;
  msg_33.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_1278,
             msg_33);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8b0,"sendrawtransaction null",(allocator<char> *)local_6a8);
  args_16._M_dataplus._M_p._4_4_ = uVar7;
  args_16._M_dataplus._M_p._0_4_ = uVar6;
  args_16._M_string_length = (size_type)__a;
  args_16.field_2._M_allocated_capacity = (size_type)pcVar8;
  args_16.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_890,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_16);
  UniValue::~UniValue(&local_890);
  std::__cxx11::string::~string(local_8b0);
  local_1288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1280 = "";
  local_1298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0xa6;
  file_34.m_begin = (iterator)&local_1288;
  msg_34.m_end = pvVar4;
  msg_34.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_1298,
             msg_34);
  local_6e8._M_dataplus._M_p._0_1_ = 0;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_12a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12a0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_6e8,(lazy_ostream *)local_6a8,1,1,WARN,(check_type)__a,
             (size_t)&local_12a8,0xa6);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_6e8.field_2._M_allocated_capacity);
  local_12e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12e0 = "";
  local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0xa7;
  file_35.m_begin = (iterator)&local_12e8;
  msg_35.m_end = pvVar4;
  msg_35.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_12f8,
             msg_35);
  std::__cxx11::string::string<std::allocator<char>>
            (local_928,"sendrawtransaction DEADBEEF",(allocator<char> *)local_6a8);
  args_17._M_dataplus._M_p._4_4_ = uVar7;
  args_17._M_dataplus._M_p._0_4_ = uVar6;
  args_17._M_string_length = (size_type)__a;
  args_17.field_2._M_allocated_capacity = (size_type)pcVar8;
  args_17.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_908,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_17);
  UniValue::~UniValue(&local_908);
  std::__cxx11::string::~string(local_928);
  local_1308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1300 = "";
  local_1318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0xa7;
  file_36.m_begin = (iterator)&local_1308;
  msg_36.m_end = pvVar4;
  msg_36.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_1318,
             msg_36);
  local_6e8._M_dataplus._M_p._0_1_ = 0;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_1328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1320 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_6e8,(lazy_ostream *)local_6a8,1,1,WARN,(check_type)__a,
             (size_t)&local_1328,0xa7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_6e8.field_2._M_allocated_capacity);
  local_1368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1360 = "";
  local_1378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0xa8;
  file_37.m_begin = (iterator)&local_1368;
  msg_37.m_end = pvVar4;
  msg_37.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_1378,
             msg_37);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"sendrawtransaction ",(allocator<char> *)&local_7a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8,
                 &local_6e8,&rawtx);
  std::operator+(&local_9a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8,
                 " extra");
  args_18._M_dataplus._M_p._4_4_ = uVar7;
  args_18._M_dataplus._M_p._0_4_ = uVar6;
  args_18._M_string_length = (size_type)__a;
  args_18.field_2._M_allocated_capacity = (size_type)pcVar8;
  args_18.field_2._8_8_ = in_stack_ffffffffffffec10;
  RPCTestingSetup::CallRPC(&local_980,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_18);
  UniValue::~UniValue(&local_980);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)local_6a8);
  std::__cxx11::string::~string((string *)&local_6e8);
  local_1388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1380 = "";
  local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0xa8;
  file_38.m_begin = (iterator)&local_1388;
  msg_38.m_end = pvVar4;
  msg_38.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_1398,
             msg_38);
  local_6e8._M_dataplus._M_p._0_4_ = (uint)local_6e8._M_dataplus._M_p._1_3_ << 8;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_allocated_capacity = 0;
  local_6a8[8] = false;
  local_6a8._0_8_ = &PTR__lazy_ostream_011489c8;
  local_698 = boost::unit_test::lazy_ostream::inst;
  local_690[0] = "exception std::runtime_error expected but not raised";
  local_13a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13a0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_6e8,(lazy_ostream *)local_6a8,1,1,WARN,(check_type)__a,
             (size_t)&local_13a8,0xa8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_6e8.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&rawtx);
  UniValue::~UniValue(&r);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_rawparams)
{
    // Test raw transaction API argument handling
    UniValue r;

    BOOST_CHECK_THROW(CallRPC("getrawtransaction"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("getrawtransaction not_hex"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("getrawtransaction a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed not_int"), std::runtime_error);

    BOOST_CHECK_THROW(CallRPC("createrawtransaction"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("createrawtransaction null null"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("createrawtransaction not_array"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("createrawtransaction {} {}"), std::runtime_error);
    BOOST_CHECK_NO_THROW(CallRPC("createrawtransaction [] {}"));
    BOOST_CHECK_THROW(CallRPC("createrawtransaction [] {} extra"), std::runtime_error);

    BOOST_CHECK_THROW(CallRPC("decoderawtransaction"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("decoderawtransaction null"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("decoderawtransaction DEADBEEF"), std::runtime_error);
    std::string rawtx = "0100000001a15d57094aa7a21a28cb20b59aab8fc7d1149a3bdbcddba9c622e4f5f6a99ece010000006c493046022100f93bb0e7d8db7bd46e40132d1f8242026e045f03a0efe71bbb8e3f475e970d790221009337cd7f1f929f00cc6ff01f03729b069a7c21b59b1736ddfee5db5946c5da8c0121033b9b137ee87d5a812d6f506efdd37f0affa7ffc310711c06c7f3e097c9447c52ffffffff0100e1f505000000001976a9140389035a9225b3839e2bbf32d826a1e222031fd888ac00000000";
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("decoderawtransaction ")+rawtx));
    BOOST_CHECK_EQUAL(r.get_obj().find_value("size").getInt<int>(), 193);
    BOOST_CHECK_EQUAL(r.get_obj().find_value("version").getInt<int>(), 1);
    BOOST_CHECK_EQUAL(r.get_obj().find_value("locktime").getInt<int>(), 0);
    BOOST_CHECK_THROW(CallRPC(std::string("decoderawtransaction ")+rawtx+" extra"), std::runtime_error);
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("decoderawtransaction ")+rawtx+" false"));
    BOOST_CHECK_THROW(r = CallRPC(std::string("decoderawtransaction ")+rawtx+" false extra"), std::runtime_error);

    // Only check failure cases for sendrawtransaction, there's no network to send to...
    BOOST_CHECK_THROW(CallRPC("sendrawtransaction"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("sendrawtransaction null"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("sendrawtransaction DEADBEEF"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC(std::string("sendrawtransaction ")+rawtx+" extra"), std::runtime_error);
}